

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

ebml_element *
EBML_FindNextElement
          (stream *Input,ebml_parser_context *pContext,int *UpperLevels,bool_t AllowDummyElt)

{
  ebml_parser_context *peVar1;
  bool bVar2;
  byte IdLength;
  ebml_parser_context *peVar3;
  filepos_t fVar4;
  long lVar5;
  bool_t bVar6;
  ebml_element *peVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ebml_parser_context *peVar11;
  byte bVar12;
  uint8_t *InBuffer;
  char cVar13;
  byte bVar14;
  undefined8 in_R9;
  bool bVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  int LevelChange;
  uint8_t PossibleIdNSize [16];
  filepos_t SizeUnknown;
  ebml_parser_context OrigContext;
  ebml_element *local_100;
  long local_f0;
  ulong local_d8;
  long local_d0;
  ebml_element *local_c8;
  int local_bc;
  uint8_t local_b8 [16];
  ulong local_a8;
  bool_t local_a0;
  long local_98;
  int *local_90;
  long local_88;
  int local_80;
  int local_7c;
  long local_78;
  ulong local_70;
  ebml_parser_context *local_68;
  ulong local_60;
  ebml_parser_context local_58;
  
  local_68 = pContext;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x1e2,
                  "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                 );
  }
  local_7c = *UpperLevels;
  local_98 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
  if (local_98 != -1) {
    local_58.EndPosition = local_68->EndPosition;
    local_58.Profile = local_68->Profile;
    local_58._28_4_ = *(undefined4 *)&local_68->field_0x1c;
    local_58.Context = local_68->Context;
    local_58.UpContext = local_68->UpContext;
    peVar3 = &local_58;
    if ((local_58.EndPosition != -1) && (peVar3 = &local_58, local_58.EndPosition <= local_98)) {
      peVar3 = &local_58;
      while (peVar11 = peVar3->UpContext, peVar11 != (ebml_parser_context *)0x0) {
        *UpperLevels = *UpperLevels + 1;
        peVar3 = peVar11;
        if ((peVar11->EndPosition == -1) || (local_98 < peVar11->EndPosition)) break;
      }
    }
    local_90 = UpperLevels;
    uVar16 = 0;
    bVar17 = 0;
    IdLength = 0;
    local_a0 = AllowDummyElt;
    local_c8 = (ebml_element *)0x0;
LAB_001196ee:
    do {
      if ('\x0f' < (char)bVar17) {
        __assert_fail("ReadIndex < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x1fc,
                      "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                     );
      }
      bVar15 = (char)bVar17 < '\x01';
      if ((char)bVar17 < '\x01') {
        bVar12 = 0;
      }
      else {
        bVar14 = bVar17 - 1;
        bVar12 = 3;
        if (bVar14 < 3) {
          bVar12 = bVar14;
        }
        if ((char)local_b8[0] < '\0') {
          bVar12 = 0;
        }
        else {
          bVar12 = bVar12 + 1;
          bVar9 = 0;
          if (2 < bVar14) {
            bVar14 = 3;
          }
          do {
            bVar8 = bVar9;
            if (bVar14 == bVar8) {
              bVar15 = 2 < bVar8 || (char)bVar17 <= (char)(bVar8 + 1);
              goto LAB_00119773;
            }
            bVar9 = bVar8 + 1;
          } while (-1 < (char)(local_b8[0] << (bVar9 & 0x1f)));
          bVar15 = 2 < bVar8 || (char)bVar17 <= (char)bVar9;
          bVar12 = bVar9;
        }
        IdLength = bVar12 + 1;
      }
LAB_00119773:
      cVar13 = '\x06';
      if ((bVar15) && (peVar3->EndPosition != uVar16 + local_98)) {
        if ('\x03' < (char)bVar17) {
          bVar17 = bVar17 - 1;
          memmove(local_b8,local_b8 + 1,(long)(char)bVar17);
        }
        lVar10 = (long)(char)bVar17;
        bVar17 = bVar17 + 1;
        lVar10 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,local_b8 + lVar10,1,0);
        if (lVar10 == 0) {
          uVar16 = (ulong)((int)uVar16 + 1);
        }
        else {
          local_c8 = (ebml_element *)0x0;
        }
        cVar13 = lVar10 != 0;
      }
      peVar11 = peVar3;
      if (cVar13 == '\0') {
        if (bVar15) goto LAB_001196ee;
LAB_00119800:
        bVar14 = bVar17 - IdLength;
        local_a8 = (ulong)IdLength;
        InBuffer = local_b8 + local_a8;
        uVar18 = (ulong)(char)bVar14;
        local_d8 = uVar18;
        fVar4 = EBML_ReadCodedSizeValue(InBuffer,&local_d8,&local_88);
        bVar15 = local_d8 != 0;
        if ((!bVar15) && ((char)bVar14 < '\b')) {
          while ((((long)uVar18 < 1 || (*InBuffer != '\0')) &&
                 (peVar3->EndPosition != uVar16 + local_98))) {
            lVar10 = (long)(char)bVar17;
            bVar17 = bVar17 + 1;
            lVar10 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,local_b8 + lVar10,1,0);
            if (lVar10 != 0) {
              local_100 = (ebml_element *)0x0;
              bVar12 = bVar17;
              cVar13 = '\x01';
              goto LAB_00119c87;
            }
            uVar16 = (ulong)((int)uVar16 + 1);
            local_d8 = uVar18 + 1;
            fVar4 = EBML_ReadCodedSizeValue(InBuffer,&local_d8,&local_88);
            bVar15 = local_d8 != 0;
            if ((bVar15) || (bVar2 = 6 < (long)uVar18, uVar18 = uVar18 + 1, bVar2)) break;
          }
        }
        local_d0 = fVar4;
        local_f0 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
        bVar6 = local_a0;
        if (bVar15) {
          bVar15 = false;
          if ((local_d0 != local_88) && (peVar3 != (ebml_parser_context *)0x0)) {
            bVar15 = false;
            if ((peVar3->EndPosition != -1) &&
               (lVar10 = (local_d0 - (char)bVar17) + local_f0, peVar3->EndPosition < lVar10)) {
              while( true ) {
                if (local_a0 != 0) {
                  bVar15 = true;
                  peVar11 = peVar3;
                  goto LAB_001199c2;
                }
                peVar1 = peVar11->UpContext;
                if (peVar1 == (ebml_parser_context *)0x0) break;
                *local_90 = *local_90 + 1;
                bVar15 = false;
                peVar11 = peVar1;
                if ((peVar1->EndPosition == -1) || (lVar10 <= peVar1->EndPosition))
                goto LAB_001199c2;
              }
              bVar15 = true;
            }
          }
        }
        else {
          bVar15 = true;
        }
LAB_001199c2:
        local_100 = local_c8;
        bVar12 = bVar17;
        if (!bVar15) {
          local_bc = 0;
          local_80 = (int)(char)IdLength;
          in_R9 = 0;
          local_100 = EBML_ElementCreateUsingContext
                                (Input,local_b8,IdLength,peVar11,&local_bc,0,local_a0);
          if (local_100 == (ebml_element *)0x0) {
LAB_00119b60:
            bVar15 = true;
            local_100 = local_c8;
          }
          else {
            if ((bVar6 == 0) && (bVar6 = EBML_ElementIsDummy(local_100), bVar6 != 0)) {
LAB_00119b58:
              NodeDelete((node *)local_100);
              goto LAB_00119b60;
            }
            lVar10 = local_88;
            if (8 < local_d8) {
              __assert_fail("_SizeLength <= 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                            ,0x24e,
                            "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                           );
            }
            local_100->SizeLength = (int8_t)local_d8;
            local_100->DataSize = local_d0;
            local_78 = (long)(char)bVar17;
            local_70 = local_d8;
            if (local_d0 == local_88) {
              fVar4 = peVar11->EndPosition;
            }
            else {
              fVar4 = (local_a8 - local_78) + local_f0 + local_d0 + local_d8;
            }
            local_60 = (ulong)(local_d0 == local_88);
            local_100->EndPosition = fVar4;
            EBML_ElementSetInfiniteSize(local_100,local_60);
            if (((local_a0 != 0) &&
                (lVar5 = (**(code **)((long)(local_100->Base).Base.VMT + 0x70))(local_100),
                lVar5 == 0)) && (bVar6 = EBML_ElementIsDummy(local_100), bVar6 == 0)) {
              NodeDelete((node *)local_100);
              local_100 = CreateElement(Input,local_b8,(int8_t)local_80,&EBML_ContextDummy,
                                        (ebml_master *)0xffffffff,(int)in_R9);
              local_100->SizeLength = (int8_t)local_70;
              local_100->DataSize = local_d0;
              if (local_d0 == lVar10) {
                fVar4 = peVar11->EndPosition;
              }
              else {
                fVar4 = (local_a8 - local_78) + local_f0 + local_d0 + local_70;
              }
              local_100->EndPosition = fVar4;
              EBML_ElementSetInfiniteSize(local_100,local_60);
            }
            if (local_100 == (ebml_element *)0x0) {
              __assert_fail("(const void*)(Result)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                            ,0x264,
                            "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                           );
            }
            lVar5 = (**(code **)((long)(local_100->Base).Base.VMT + 0x70))();
            if (lVar5 == 0) goto LAB_00119b58;
            if (local_d0 == lVar10) {
              local_100->DataSize = -1;
            }
            if (0 < local_bc) {
              *local_90 = *local_90 + local_bc;
            }
            lVar10 = local_a8 + (local_f0 - local_78);
            local_100->SizePosition = lVar10;
            local_100->ElementPosition = local_f0 - local_78;
            bVar15 = false;
            (**(code **)((long)(Input->Base).VMT + 0x78))(Input,local_70 + lVar10,0);
          }
          cVar13 = '\x01';
          if (!bVar15) goto LAB_00119c87;
        }
        lVar10 = peVar11->EndPosition;
        if ((lVar10 == -1) || (local_f0 < lVar10)) {
          memmove(local_b8,local_b8 + 1,(long)(char)(bVar17 - 1));
          *local_90 = local_7c;
          local_58.Context = local_68->Context;
          local_58.UpContext = local_68->UpContext;
          local_58.EndPosition = local_68->EndPosition;
          local_58.Profile = local_68->Profile;
          local_58._28_4_ = *(undefined4 *)&local_68->field_0x1c;
          peVar11 = &local_58;
          bVar14 = bVar17 - 1;
          cVar13 = '\0';
        }
        else {
          cVar13 = '\x04';
          if (((local_a0 != 0) && (lVar10 != local_f0)) &&
             (peVar7 = CreateElement(Input,local_b8,IdLength,&EBML_ContextDummy,
                                     (ebml_master *)0xffffffff,(int)in_R9), cVar13 = '\x04',
             peVar7 != (ebml_element *)0x0)) {
            lVar10 = local_a8 + (local_f0 - (char)bVar17);
            peVar7->SizePosition = lVar10;
            peVar7->ElementPosition = local_f0 - (char)bVar17;
            peVar7->DataSize = 0;
            fVar4 = peVar11->EndPosition;
            peVar7->SizeLength = (char)fVar4 - (char)lVar10;
            peVar7->EndPosition = fVar4;
            (**(code **)((long)(Input->Base).VMT + 0x78))(Input,fVar4,0);
            local_100 = peVar7;
            cVar13 = '\x01';
          }
        }
      }
      else {
        local_100 = local_c8;
        bVar14 = bVar17;
        if (cVar13 == '\x06') goto LAB_00119800;
      }
LAB_00119c87:
      bVar17 = bVar14;
      if (cVar13 != '\0') {
        if (cVar13 == '\x04') {
          return (ebml_element *)0x0;
        }
        return local_100;
      }
      local_c8 = local_100;
      peVar3 = peVar11;
    } while ((peVar11->EndPosition == -1) ||
            ((long)(((ulong)IdLength - (long)(char)bVar12) + local_f0) < peVar11->EndPosition));
  }
  return (ebml_element *)0x0;
}

Assistant:

ebml_element *EBML_FindNextElement(struct stream *Input, const ebml_parser_context *pContext, int *UpperLevels, bool_t AllowDummyElt)
{
    uint8_t PossibleID_Length = 0;
    uint8_t PossibleIdNSize[16];
    int PossibleSizeLength;
    filepos_t SizeUnknown;
    int8_t SizeIdx,ReadIndex = 0; // trick for the algo, start index at 0
    uint32_t ReadSize = 0;
    filepos_t SizeFound;
    bool_t bFound;
    int UpperLevel_original = *UpperLevels;
    filepos_t CurrentPos;
    filepos_t StartPos = Stream_Seek(Input,0,SEEK_CUR);
    ebml_parser_context OrigContext;
    const ebml_parser_context *Context = &OrigContext;

    if (StartPos == INVALID_FILEPOS_T)
        return NULL;

    assert(Context != NULL);
    OrigContext = *pContext;

    // adjust the Context to allow the StartPos to make sense
    while (Context && Context->EndPosition != INVALID_FILEPOS_T && (StartPos >= Context->EndPosition))
    {
        if (Context->UpContext==NULL)
            break;
        Context = Context->UpContext;
        (*UpperLevels)++;
    }

    do {
        size_t _SizeLength;

        // read a potential ID
        do {
            uint8_t IdBitMask = 1 << 7;

            assert(ReadIndex < 16);
            // build the ID with the current Read Buffer
            bFound = 0;
            for (SizeIdx = 0; SizeIdx < ReadIndex && SizeIdx < 4; SizeIdx++) {
                if (PossibleIdNSize[0] & (IdBitMask >> SizeIdx)) {
                    // ID found
                    PossibleID_Length = SizeIdx + 1;
                    IdBitMask >>= SizeIdx;
                    bFound = 1;
                    break;
                }
            }
            if (bFound)
                break;
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit

            if (ReadIndex >= 4) {
                // ID not found
                // shift left the read octets
                memmove(&PossibleIdNSize[0],&PossibleIdNSize[1], --ReadIndex);
            }

            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[ReadIndex++], 1, NULL)!=ERR_NONE)
                return NULL; // no more data ?
            ReadSize++;

        } while (!bFound);

        SizeIdx = ReadIndex;
        ReadIndex = ReadIndex - PossibleID_Length;

        // read the data size
        PossibleSizeLength = ReadIndex;
        bFound = 0;
        while (1)
        {
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleIdNSize[PossibleID_Length], &_SizeLength, &SizeUnknown);
            if (_SizeLength != 0) {
                bFound = 1;
                break;
            }
            if (PossibleSizeLength >= 8)
                break;
            if (PossibleSizeLength > 0 && PossibleIdNSize[PossibleID_Length] == 0)
                break; // invalid all zero size
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit
            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[SizeIdx++], 1, NULL)!=ERR_NONE)
                return NULL;
            ReadSize++;
            PossibleSizeLength++;
        }

        CurrentPos = Stream_Seek(Input,0,SEEK_CUR);
        if (bFound)
        {
            // make sure the element we found is contained in the Context
            if (SizeFound != SizeUnknown)
            {
                while (Context && Context->EndPosition != INVALID_FILEPOS_T && (CurrentPos + SizeFound - SizeIdx > Context->EndPosition))
                {
                    if (AllowDummyElt || Context->UpContext==NULL)
                    {
                        bFound = 0;
                        break;
                    }
                    Context = Context->UpContext;
                    (*UpperLevels)++;
                }
            }
        }

        if (bFound)
        {
            // find the element in the context and use the correct creator
            int LevelChange = 0;
            ebml_element *Result = EBML_ElementCreateUsingContext(Input, PossibleIdNSize, PossibleID_Length, Context, &LevelChange, 0, AllowDummyElt);
            if (Result != NULL)
            {
                if (AllowDummyElt || !EBML_ElementIsDummy(Result)) {
                    assert(_SizeLength <= 8);
                    Result->SizeLength = (int8_t)_SizeLength;
                    Result->DataSize = SizeFound;
                    Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                    EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);

                    if (AllowDummyElt && !EBML_ElementValidateSize(Result) && !EBML_ElementIsDummy(Result))
                    {
                        // the element has a good ID but wrong size, so replace with a dummy
                        NodeDelete((node*)Result);
                        Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                        Result->SizeLength = (int8_t)_SizeLength;
                        Result->DataSize = SizeFound;
                        Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                        EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);
                    }

                    // LevelChange values
                    // -1 : global element
                    //  0 : child
                    //  1 : same level
                    //  + : further parent
                    if (EBML_ElementValidateSize(Result))
                    {
                        if (SizeFound == SizeUnknown)
                        {
                            Result->DataSize = INVALID_FILEPOS_T;
                        }

                        if (LevelChange > 0)
                            *UpperLevels += LevelChange;
                        Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                        Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                        // place the file at the beggining of the data
                        Stream_Seek(Input,Result->SizePosition + _SizeLength,SEEK_SET);
                        return Result;
                    }
                }
                NodeDelete((node*)Result);
            }
        }

        if (Context->EndPosition!=INVALID_FILEPOS_T && Context->EndPosition <= CurrentPos)
        {
            if (AllowDummyElt && Context->EndPosition != CurrentPos)
            {
                /* add a dummy placeholder for the remaining of the parent */
                int LevelChange = 0;
                ebml_element *Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                if (Result != NULL)
                {
                    if (LevelChange > 0)
                        *UpperLevels += LevelChange;
                    Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                    Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                    Result->DataSize = 0;
                    Result->SizeLength = (int8_t)(Context->EndPosition - Result->SizePosition);
                    Result->EndPosition = Context->EndPosition;
                    // place the file at the end of the element
                    Stream_Seek(Input,Context->EndPosition,SEEK_SET);
                    return Result;
                }
            }
            break; // we should not read further than our limit
        }

        // recover all the data in the buffer minus one byte
        ReadIndex = SizeIdx - 1;
        memmove(&PossibleIdNSize[0], &PossibleIdNSize[1], ReadIndex);
        *UpperLevels = UpperLevel_original;
        OrigContext = *pContext;
        Context = &OrigContext;
    } while (Context->EndPosition==INVALID_FILEPOS_T || (Context->EndPosition > CurrentPos - SizeIdx + PossibleID_Length));

    return NULL;
}